

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O2

float __thiscall Imath_3_2::Vec2<float>::lengthTiny(Vec2<float> *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = ABS(this->x);
  fVar3 = ABS(this->y);
  fVar4 = fVar3;
  if (fVar3 <= fVar2) {
    fVar4 = fVar2;
  }
  fVar1 = 0.0;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar1 = SQRT((fVar2 / fVar4) * (fVar2 / fVar4) + (fVar3 / fVar4) * (fVar3 / fVar4)) * fVar4;
  }
  return fVar1;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec2<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = std::abs (x);
    T absY = std::abs (y);

    T max = absX;

    if (max < absY) max = absY;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;

    return max * std::sqrt (absX * absX + absY * absY);
}